

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O2

Chain __thiscall S2Polygon::Shape::chain(Shape *this,int i)

{
  uint uVar1;
  pointer puVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  S2LogMessage SStack_18;
  
  puVar2 = (this->polygon_->loops_).
           super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (i < (int)((ulong)((long)(this->polygon_->loops_).
                              super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2) >> 3)) {
    if (this->cumulative_edges_ == (int *)0x0) {
      uVar4 = 0;
      uVar5 = 0;
      if (0 < i) {
        uVar5 = (ulong)(uint)i;
      }
      uVar3 = 0;
      for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
        uVar3 = uVar3 + *(int *)((long)puVar2[uVar4]._M_t.
                                       super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>.
                                       _M_t + 0xc);
      }
      uVar1 = *(uint *)((long)puVar2[i]._M_t.
                              super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t + 0xc
                       );
      uVar4 = 0;
      if (uVar1 != 1) {
        uVar4 = (ulong)uVar1;
      }
    }
    else {
      uVar3 = this->cumulative_edges_[i];
      uVar4 = (ulong)*(uint *)((long)puVar2[i]._M_t.
                                     super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>.
                                     _M_t + 0xc);
    }
    return (Chain)((ulong)uVar3 | uVar4 << 0x20);
  }
  S2LogMessage::S2LogMessage
            (&SStack_18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polygon.cc"
             ,0x5f1,kFatal,(ostream *)&std::cerr);
  std::operator<<(SStack_18.stream_,"Check failed: (i) < (Shape::num_chains()) ");
  abort();
}

Assistant:

int S2Polygon::Shape::num_chains() const {
  return polygon_->num_loops();
}